

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_read__null
                    (ma_device *pDevice,void *pPCMFrames,ma_uint32 frameCount,ma_uint32 *pFramesRead
                    )

{
  ma_uint32 *pmVar1;
  ma_uint32 mVar2;
  ma_uint32 mVar3;
  ma_uint64 mVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = 0;
  }
  uVar7 = 0;
  while (uVar6 = frameCount - uVar7, uVar8 = uVar7, uVar7 <= frameCount && uVar6 != 0) {
    uVar8 = (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture;
    if (uVar8 == 0) {
      mVar3 = 0;
    }
    else {
      iVar5 = *(int *)(&DAT_001127b0 + (ulong)(pDevice->capture).internalFormat * 4) *
              (pDevice->capture).internalChannels;
      if (uVar8 < uVar6) {
        uVar6 = uVar8;
      }
      memset((void *)((ulong)(iVar5 * uVar7) + (long)pPCMFrames),0,(ulong)(iVar5 * uVar6));
      mVar3 = (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture - uVar6;
      uVar7 = uVar7 + uVar6;
    }
    (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture = mVar3;
    if (frameCount <= uVar7 && uVar7 != frameCount) {
      __assert_fail("totalPCMFramesProcessed <= frameCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x25c1,
                    "ma_result ma_device_read__null(ma_device *, void *, ma_uint32, ma_uint32 *)");
    }
    uVar8 = frameCount;
    if (uVar7 == frameCount) break;
    mVar3 = (pDevice->capture).internalPeriodSizeInFrames;
    mVar2 = (pDevice->field_23).null_device.lastProcessedFrameCapture;
    while (((pDevice->field_23).null_device.isStarted != 0 &&
           (mVar4 = ma_device_get_total_run_time_in_frames__null(pDevice), mVar4 < mVar3 + mVar2)))
    {
      ma_sleep(10);
    }
    mVar3 = (pDevice->capture).internalPeriodSizeInFrames;
    pmVar1 = &(pDevice->field_23).null_device.lastProcessedFrameCapture;
    *pmVar1 = *pmVar1 + mVar3;
    (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture = mVar3;
  }
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = uVar8;
  }
  return (ma_result)pFramesRead;
}

Assistant:

static ma_result ma_device_read__null(ma_device* pDevice, void* pPCMFrames, ma_uint32 frameCount, ma_uint32* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint32 totalPCMFramesProcessed;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    /* Keep going until everything has been read. */
    totalPCMFramesProcessed = 0;
    while (totalPCMFramesProcessed < frameCount) {
        ma_uint64 targetFrame;

        /* If there are any frames remaining in the current period, consume those first. */
        if (pDevice->null_device.currentPeriodFramesRemainingCapture > 0) {
            ma_uint32 bpf = ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
            ma_uint32 framesRemaining = (frameCount - totalPCMFramesProcessed);
            ma_uint32 framesToProcess = pDevice->null_device.currentPeriodFramesRemainingCapture;
            if (framesToProcess > framesRemaining) {
                framesToProcess = framesRemaining;
            }

            /* We need to ensured the output buffer is zeroed. */
            MA_ZERO_MEMORY(ma_offset_ptr(pPCMFrames, totalPCMFramesProcessed*bpf), framesToProcess*bpf);

            pDevice->null_device.currentPeriodFramesRemainingCapture -= framesToProcess;
            totalPCMFramesProcessed += framesToProcess;
        }

        /* If we've consumed the current period we'll need to mark it as such an ensure the device is started if it's not already. */
        if (pDevice->null_device.currentPeriodFramesRemainingCapture == 0) {
            pDevice->null_device.currentPeriodFramesRemainingCapture = 0;
        }

        /* If we've consumed the whole buffer we can return now. */
        MA_ASSERT(totalPCMFramesProcessed <= frameCount);
        if (totalPCMFramesProcessed == frameCount) {
            break;
        }

        /* Getting here means we've still got more frames to consume, we but need to wait for it to become available. */
        targetFrame = pDevice->null_device.lastProcessedFrameCapture + pDevice->capture.internalPeriodSizeInFrames;
        for (;;) {
            ma_uint64 currentFrame;

            /* Stop waiting if the device has been stopped. */
            if (!pDevice->null_device.isStarted) {
                break;
            }

            currentFrame = ma_device_get_total_run_time_in_frames__null(pDevice);
            if (currentFrame >= targetFrame) {
                break;
            }

            /* Getting here means we haven't yet reached the target sample, so continue waiting. */
            ma_sleep(10);
        }

        pDevice->null_device.lastProcessedFrameCapture          += pDevice->capture.internalPeriodSizeInFrames;
        pDevice->null_device.currentPeriodFramesRemainingCapture = pDevice->capture.internalPeriodSizeInFrames;
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalPCMFramesProcessed;
    }

    return result;
}